

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMLSParserImpl.cpp
# Opt level: O0

void __thiscall xercesc_4_0::DOMLSParserImpl::docPI(DOMLSParserImpl *this,XMLCh *target,XMLCh *data)

{
  bool bVar1;
  uint uVar2;
  ShowType whatToShow;
  XMLCh *data_local;
  XMLCh *target_local;
  DOMLSParserImpl *this_local;
  
  if (((this->fFilter != (DOMLSParserFilter *)0x0) &&
      (this->fFilterDelayedTextNodes != (ValueHashTableOf<bool,_xercesc_4_0::PtrHasher> *)0x0)) &&
     (bVar1 = ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::containsKey
                        (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode)
     , bVar1)) {
    ValueHashTableOf<bool,_xercesc_4_0::PtrHasher>::removeKey
              (this->fFilterDelayedTextNodes,(this->super_AbstractDOMParser).fCurrentNode);
    applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
  }
  AbstractDOMParser::docPI(&this->super_AbstractDOMParser,target,data);
  if ((this->fFilter != (DOMLSParserFilter *)0x0) &&
     (uVar2 = (*this->fFilter->_vptr_DOMLSParserFilter[4])(), (uVar2 & 0x40) != 0)) {
    applyFilter(this,(this->super_AbstractDOMParser).fCurrentNode);
  }
  return;
}

Assistant:

void DOMLSParserImpl::docPI(const XMLCh* const    target
                          , const XMLCh* const    data)
{
    if(fFilter)
    {
        // send the notification for the previous text node
        if(fFilterDelayedTextNodes && fFilterDelayedTextNodes->containsKey(fCurrentNode))
        {
            fFilterDelayedTextNodes->removeKey(fCurrentNode);
            applyFilter(fCurrentNode);
        }
    }

    AbstractDOMParser::docPI(target, data);
    if(fFilter)
    {
        DOMNodeFilter::ShowType whatToShow=fFilter->getWhatToShow();
        if(whatToShow & DOMNodeFilter::SHOW_PROCESSING_INSTRUCTION)
            applyFilter(fCurrentNode);
    }
}